

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O2

void do_command(string *cmd_string,bool suppress)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  int **ppiVar4;
  bool **ppbVar5;
  int **arr;
  int **arr_00;
  pointer pcVar6;
  pointer pMVar7;
  size_type sVar8;
  bool bVar9;
  int i_4;
  int iVar10;
  uint uVar11;
  istream *piVar12;
  ostream *poVar13;
  long *plVar14;
  size_t __n;
  ulong uVar15;
  Move *m_1;
  _Alloc_hider _Var16;
  pointer m_00;
  char *pcVar17;
  Move *this;
  size_type sVar18;
  int i_3;
  long lVar19;
  int i_5;
  char *pcVar20;
  int i;
  int j;
  string ss;
  int p;
  string acr;
  string command;
  Move m;
  stringstream line;
  byte abStack_198 [360];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&line,(string *)cmd_string,_S_out|_S_in);
  command._M_dataplus._M_p = (pointer)&command.field_2;
  command._M_string_length = 0;
  command.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)&line,(string *)&command);
  bVar9 = std::operator==(&command,"game");
  if (bVar9) {
    game_loop();
    goto LAB_0010aed8;
  }
  bVar9 = std::operator==(&command,"pb");
  if (bVar9) {
    find_moves();
    if (moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      sort_moves(true);
      pMVar7 = moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data
               ._M_start;
      place_move(moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                 super__Vector_impl_data._M_start,false);
      if (!suppress) {
        print_board();
        operator<<((ostream *)&std::cout,pMVar7);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      goto LAB_0010aed8;
    }
    if (suppress) goto LAB_0010aed8;
    pcVar17 = "No moves";
LAB_0010a95c:
    poVar13 = std::operator<<((ostream *)&std::cout,pcVar17);
LAB_0010a96b:
    std::endl<char,std::char_traits<char>>(poVar13);
    goto LAB_0010aed8;
  }
  bVar9 = std::operator==(&command,"pm");
  paVar1 = &ss.field_2;
  if (bVar9) {
    ss._M_string_length = 0;
    ss.field_2._M_local_buf[0] = '\0';
    acr._M_dataplus._M_p = (pointer)&acr.field_2;
    acr._M_string_length = 0;
    acr.field_2._M_local_buf[0] = '\0';
    ss._M_dataplus._M_p = (pointer)paVar1;
    piVar12 = std::operator>>((istream *)&line,(string *)&ss);
    if ((((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) == 0) &&
       ((bVar9 = std::operator==(&ss,"-f"), !bVar9 ||
        (piVar12 = std::operator>>((istream *)&line,(string *)&ss),
        ((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) == 0)))) {
      plVar14 = (long *)std::istream::operator>>((istream *)&line,&i);
      if (((*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) != 0) ||
         (plVar14 = (long *)std::istream::operator>>((istream *)&line,&j),
         (*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) != 0)) {
        i = (bsize + 1) / 2;
        j = i;
      }
      piVar12 = std::operator>>((istream *)&line,(string *)&acr);
      if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) {
        std::__cxx11::string::assign((char *)&acr);
      }
      plVar14 = (long *)std::istream::operator>>((istream *)&line,&p);
      sVar8 = ss._M_string_length;
      _Var16 = ss._M_dataplus;
      if ((*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) != 0) {
        p = -1;
      }
      for (sVar18 = 0; sVar8 != sVar18; sVar18 = sVar18 + 1) {
        iVar10 = toupper((int)_Var16._M_p[sVar18]);
        _Var16._M_p[sVar18] = (char)iVar10;
      }
      Move::Move(&m,&ss,i,j,bsize,*acr._M_dataplus._M_p != 'd',0,p,0);
      place_move(&m,bVar9);
LAB_0010aebf:
      Move::~Move(&m);
    }
LAB_0010aec4:
    std::__cxx11::string::~string((string *)&acr);
LAB_0010aece:
    this = (Move *)&ss;
  }
  else {
    bVar9 = std::operator==(&command,"il");
    if (bVar9) {
      ss._M_string_length = 0;
      ss.field_2._M_local_buf[0] = '\0';
      acr._M_dataplus._M_p = (pointer)&acr.field_2;
      acr._M_string_length = 0;
      acr.field_2._M_local_buf[0] = '\0';
      ss._M_dataplus._M_p = (pointer)paVar1;
      piVar12 = std::operator>>((istream *)&line,(string *)&ss);
      if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) == 0) {
        plVar14 = (long *)std::istream::operator>>((istream *)&line,&i);
        if (((*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) != 0) ||
           (plVar14 = (long *)std::istream::operator>>((istream *)&line,&j),
           (*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) != 0)) {
          i = (bsize + 1) / 2;
          j = i;
        }
        piVar12 = std::operator>>((istream *)&line,(string *)&acr);
        if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) {
          std::__cxx11::string::assign((char *)&acr);
        }
        plVar14 = (long *)std::istream::operator>>((istream *)&line,&p);
        sVar8 = ss._M_string_length;
        _Var16 = ss._M_dataplus;
        if ((*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) != 0) {
          p = -1;
        }
        for (sVar18 = 0; sVar8 != sVar18; sVar18 = sVar18 + 1) {
          iVar10 = toupper((int)_Var16._M_p[sVar18]);
          _Var16._M_p[sVar18] = (char)iVar10;
        }
        Move::Move(&m,&ss,i,j,bsize,*acr._M_dataplus._M_p != 'd',0,p,0);
        is_legal(&m);
        operator<<((ostream *)&std::cout,&m);
        poVar13 = std::operator<<((ostream *)&std::cout," legal: ");
        poVar13 = std::ostream::_M_insert<bool>(SUB81(poVar13,0));
        std::endl<char,std::char_traits<char>>(poVar13);
        goto LAB_0010aebf;
      }
      goto LAB_0010aec4;
    }
    bVar9 = std::operator==(&command,"rm");
    if (bVar9) {
      piVar12 = (istream *)std::istream::operator>>((istream *)&line,(int *)&m);
      plVar14 = (long *)std::istream::operator>>(piVar12,(int *)&ss);
      if ((*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) == 0) {
        board[(int)m.word._M_dataplus._M_p][(int)ss._M_dataplus._M_p] = '\0';
        points[(int)m.word._M_dataplus._M_p][(int)ss._M_dataplus._M_p] = 0;
      }
      goto LAB_0010aed8;
    }
    bVar9 = std::operator==(&command,"pr");
    paVar2 = &m.word.field_2;
    if (!bVar9) {
      bVar9 = std::operator==(&command,"cl");
      if (bVar9) {
        m.word._M_string_length = 0;
        m.word.field_2._M_local_buf[0] = '\0';
        m.word._M_dataplus._M_p = (pointer)paVar2;
        piVar12 = std::operator>>((istream *)&line,(string *)&m);
        _Var16._M_p = m.word._M_dataplus._M_p;
        if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) == 0) {
          iVar10 = toupper((int)*m.word._M_dataplus._M_p);
          *_Var16._M_p = (char)iVar10;
          calc_legal(*m.word._M_dataplus._M_p);
          ppbVar5 = (*legal)[(long)*m.word._M_dataplus._M_p + -0x41];
          std::operator+(&acr,"legal[0][",&m.word);
          std::operator+(&ss,&acr,"]");
          print(ppbVar5,&ss);
          std::__cxx11::string::~string((string *)&ss);
          std::__cxx11::string::~string((string *)&acr);
          ppbVar5 = legal[1][(long)*m.word._M_dataplus._M_p + -0x41];
          std::operator+(&acr,"legal[1][",&m.word);
          std::operator+(&ss,&acr,"]");
          print(ppbVar5,&ss);
          std::__cxx11::string::~string((string *)&ss);
          std::__cxx11::string::~string((string *)&acr);
        }
        goto LAB_0010af48;
      }
      bVar9 = std::operator==(&command,"swap");
      if (bVar9) {
        m.word._M_string_length = 0;
        m.word.field_2._M_local_buf[0] = '\0';
        m.word._M_dataplus._M_p = (pointer)paVar2;
        piVar12 = std::operator>>((istream *)&line,(string *)&m);
        sVar8 = m.word._M_string_length;
        _Var16._M_p = m.word._M_dataplus._M_p;
        if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) == 0) {
          for (sVar18 = 0; pcVar17 = rack, sVar8 != sVar18; sVar18 = sVar18 + 1) {
            pcVar20 = rack + rack_size;
            iVar10 = toupper((int)_Var16._M_p[sVar18]);
            ss._M_dataplus._M_p._0_4_ = iVar10;
            pcVar17 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                (pcVar17,pcVar20,&ss);
            if (pcVar17 != rack + rack_size) {
              iVar10 = rand();
              pcVar6 = bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar15 = (ulong)(long)iVar10 %
                       (ulong)((long)bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                    super__Vector_impl_data._M_start);
              cVar3 = *pcVar17;
              *pcVar17 = bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar15];
              pcVar6[uVar15] = cVar3;
            }
          }
        }
        goto LAB_0010af48;
      }
      bVar9 = std::operator==(&command,"ra");
      if (bVar9) {
        while ((abStack_198[*(long *)(_line + -0x18)] & 5) == 0) {
          m.word._M_string_length = 0;
          m.word.field_2._M_local_buf[0] = '\0';
          m.word._M_dataplus._M_p = (pointer)paVar2;
          std::operator>>((istream *)&line,(string *)&m);
          sVar8 = m.word._M_string_length;
          _Var16._M_p = m.word._M_dataplus._M_p;
          if (*m.word._M_dataplus._M_p == '+') {
            uVar11 = (int)m.word._M_dataplus._M_p[1] - 0x30;
            if (uVar11 < 10) {
              for (; (bVar9 = uVar11 != 0, uVar11 = uVar11 - 1, bVar9 &&
                     (bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start !=
                      bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish));
                  bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish + -1) {
                lVar19 = (long)rack_size;
                rack_size = rack_size + 1;
                rack[lVar19] = bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_finish[-1];
              }
            }
            else {
              for (sVar18 = 0; sVar8 != sVar18; sVar18 = sVar18 + 1) {
                iVar10 = toupper((int)_Var16._M_p[sVar18]);
                lVar19 = (long)rack_size;
                rack_size = rack_size + 1;
                rack[lVar19] = (char)iVar10;
              }
            }
          }
          if (*m.word._M_dataplus._M_p == '-') {
            for (uVar15 = 1; pcVar17 = rack, uVar15 < m.word._M_string_length; uVar15 = uVar15 + 1)
            {
              pcVar20 = rack + rack_size;
              iVar10 = toupper((int)m.word._M_dataplus._M_p[uVar15]);
              ss._M_dataplus._M_p._0_4_ = iVar10;
              pcVar17 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                  (pcVar17,pcVar20,&ss);
              lVar19 = (long)rack_size;
              if (pcVar17 != rack + lVar19) {
                rack_size = rack_size + -1;
                __n = (long)(rack + lVar19) - (long)(pcVar17 + 1);
                if (__n != 0) {
                  memmove(pcVar17,pcVar17 + 1,__n);
                }
              }
            }
          }
          std::__cxx11::string::~string((string *)&m);
        }
        if (suppress) goto LAB_0010aed8;
        poVar13 = (ostream *)&std::cout;
        std::operator<<((ostream *)&std::cout,"rack: ");
        for (lVar19 = 0; lVar19 < rack_size; lVar19 = lVar19 + 1) {
          std::operator<<((ostream *)&std::cout,rack[lVar19]);
        }
        goto LAB_0010a96b;
      }
      bVar9 = std::operator==(&command,"lm");
      if (bVar9) {
        ss._M_string_length = 0;
        ss.field_2._M_local_buf[0] = '\0';
        j = 0;
        i = 999999;
        bVar9 = false;
        ss._M_dataplus._M_p = (pointer)paVar1;
        while (piVar12 = std::operator>>((istream *)&line,(string *)&ss),
              ((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) == 0) {
          if (*ss._M_dataplus._M_p == '-') {
            std::__cxx11::stringstream::stringstream((stringstream *)&m);
            if (2 < ss._M_string_length) {
              std::__cxx11::string::substr((ulong)&acr,(ulong)&ss);
              std::operator<<((ostream *)m.word.field_2._M_local_buf,(string *)&acr);
              std::__cxx11::string::~string((string *)&acr);
            }
            cVar3 = ss._M_dataplus._M_p[1];
            if (cVar3 == 'h') {
              bVar9 = true;
            }
            else if (cVar3 == 'n') {
              plVar14 = (long *)std::istream::operator>>((istream *)&m,&i);
              if ((*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) != 0) {
                i = 999999;
              }
            }
            else if ((cVar3 == 's') &&
                    (plVar14 = (long *)std::istream::operator>>((istream *)&m,&j),
                    (*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) != 0)) {
              j = 0;
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)&m);
          }
        }
        find_moves();
        sort_moves(bVar9);
        pMVar7 = moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        m_00 = moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data
               ._M_start;
        while (((m_00 != pMVar7 && (j <= m_00->score)) && (bVar9 = i != 0, i = i + -1, bVar9))) {
          *(undefined8 *)(std::ostream::write + *(long *)(std::cout + -0x18)) = 0xb;
          poVar13 = std::operator<<(&std::cout,0x20);
          operator<<(poVar13,m_00);
          std::endl<char,std::char_traits<char>>(poVar13);
          m_00 = m_00 + 1;
        }
      }
      else {
        bVar9 = std::operator==(&command,"db");
        if (bVar9) {
          std::istream::_M_extract<bool>((bool *)&line);
          goto LAB_0010aed8;
        }
        bVar9 = std::operator==(&command,"file");
        if (!bVar9) {
          bVar9 = std::operator==(&command,"word");
          if (bVar9) {
            m.word._M_string_length = 0;
            m.word.field_2._M_local_buf[0] = '\0';
            m.word._M_dataplus._M_p = (pointer)paVar2;
            piVar12 = std::operator>>((istream *)&line,(string *)&m);
            sVar8 = m.word._M_string_length;
            _Var16._M_p = m.word._M_dataplus._M_p;
            if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) == 0) {
              for (sVar18 = 0; sVar8 != sVar18; sVar18 = sVar18 + 1) {
                iVar10 = toupper((int)_Var16._M_p[sVar18]);
                _Var16._M_p[sVar18] = (char)iVar10;
              }
              is_word(&m.word);
              poVar13 = std::ostream::_M_insert<bool>(true);
              std::endl<char,std::char_traits<char>>(poVar13);
            }
          }
          else {
            bVar9 = std::operator==(&command,"clear");
            if (bVar9) {
              clear();
              goto LAB_0010aed8;
            }
            bVar9 = std::operator==(&command,"ip");
            if (!bVar9) {
              pcVar17 = "Invalid command, try again.";
              goto LAB_0010a95c;
            }
            m.word._M_string_length = 0;
            m.word.field_2._M_local_buf[0] = '\0';
            m.word._M_dataplus._M_p = (pointer)paVar2;
            std::operator>>((istream *)&line,(string *)&m);
            sVar8 = m.word._M_string_length;
            _Var16._M_p = m.word._M_dataplus._M_p;
            uVar15 = 0;
            for (sVar18 = 0; sVar8 != sVar18; sVar18 = sVar18 + 1) {
              iVar10 = toupper((int)_Var16._M_p[sVar18]);
              uVar15 = (long)((iVar10 + (int)uVar15) * 0x1b + -0x6c0) % 0xdaf26b & 0xffffffff;
            }
            poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar15 / 0x1b);
            poVar13 = std::operator<<(poVar13,":");
            poVar13 = std::ostream::_M_insert<bool>(SUB81(poVar13,0));
            std::endl<char,std::char_traits<char>>(poVar13);
          }
          goto LAB_0010af48;
        }
        ss._M_string_length = 0;
        ss.field_2._M_local_buf[0] = '\0';
        ss._M_dataplus._M_p = (pointer)paVar1;
        piVar12 = std::operator>>((istream *)&line,(string *)&ss);
        if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) == 0) {
          std::fstream::fstream(&m,(string *)&ss,_S_out|_S_in);
          if ((*(byte *)((long)&m.length + *(long *)(m.word._M_dataplus._M_p + -0x18)) & 5) != 0) {
            poVar13 = std::operator<<((ostream *)&std::cout,(string *)&ss);
            poVar13 = std::operator<<(poVar13," not found");
            std::endl<char,std::char_traits<char>>(poVar13);
          }
          while ((*(byte *)((long)&m.length + *(long *)(m.word._M_dataplus._M_p + -0x18)) & 5) == 0)
          {
            acr._M_string_length = 0;
            acr.field_2._M_local_buf[0] = '\0';
            acr._M_dataplus._M_p = (pointer)&acr.field_2;
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&m,(string *)&acr);
            do_command(&acr,suppress);
            std::__cxx11::string::~string((string *)&acr);
          }
          std::fstream::~fstream(&m);
        }
      }
      goto LAB_0010aece;
    }
    m.word._M_string_length = 0;
    m.word.field_2._M_local_buf[0] = '\0';
    m.word._M_dataplus._M_p = (pointer)paVar2;
    std::operator>>((istream *)&line,(string *)&m);
    pcVar17 = m.word._M_dataplus._M_p + m.word._M_string_length;
    for (_Var16._M_p = m.word._M_dataplus._M_p; arr_00 = points, arr = letter_mult,
        ppiVar4 = word_mult, _Var16._M_p != pcVar17; _Var16._M_p = _Var16._M_p + 1) {
      cVar3 = *_Var16._M_p;
      if (cVar3 == 'a') {
        ppiVar4 = *adj;
        std::__cxx11::string::string((string *)&ss,"adj[0]:",(allocator *)&acr);
        print(ppiVar4,&ss,3);
        std::__cxx11::string::~string((string *)&ss);
        ppiVar4 = adj[1];
        std::__cxx11::string::string((string *)&ss,"adj[1]:",(allocator *)&acr);
        print(ppiVar4,&ss,3);
LAB_0010ad4f:
        std::__cxx11::string::~string((string *)&ss);
      }
      else {
        if (cVar3 == 'w') {
          std::__cxx11::string::string((string *)&ss,"word multipliers:",(allocator *)&acr);
          print(ppiVar4,&ss,1);
          goto LAB_0010ad4f;
        }
        if (cVar3 == 'l') {
          std::__cxx11::string::string((string *)&ss,"letter multipliers:",(allocator *)&acr);
          print(arr,&ss,1);
          goto LAB_0010ad4f;
        }
        if (cVar3 == 'p') {
          std::__cxx11::string::string((string *)&ss,"tile values:",(allocator *)&acr);
          print(arr_00,&ss,3);
          goto LAB_0010ad4f;
        }
        if (cVar3 == 'r') {
          std::operator<<((ostream *)&std::cout,"rack: ");
          for (lVar19 = 0; lVar19 < rack_size; lVar19 = lVar19 + 1) {
            std::operator<<((ostream *)&std::cout,rack[lVar19]);
          }
          poVar13 = (ostream *)&std::cout;
LAB_0010ad5c:
          std::endl<char,std::char_traits<char>>(poVar13);
        }
        else {
          if (cVar3 != 'b') {
            poVar13 = std::operator<<((ostream *)&std::cout,"Invalid print command: ");
            poVar13 = std::operator<<(poVar13,cVar3);
            goto LAB_0010ad5c;
          }
          poVar13 = std::operator<<((ostream *)&std::cout,"board:");
          std::endl<char,std::char_traits<char>>(poVar13);
          print_board();
        }
      }
    }
LAB_0010af48:
    this = &m;
  }
  std::__cxx11::string::~string((string *)this);
LAB_0010aed8:
  std::__cxx11::string::~string((string *)&command);
  std::__cxx11::stringstream::~stringstream((stringstream *)&line);
  return;
}

Assistant:

void do_command(string &cmd_string, bool suppress) {
    stringstream line(cmd_string);
    string command;
    line >> command;
    if (command == "game") {
        game_loop();
    } else if (command == "pb") { // play best move (according to bot)
        find_moves();
        if (moves.empty()) {
            if (!suppress) cout << "No moves" << endl;
            return;
        }
        sort_moves();
        Move &mm = moves.front();
        place_move(mm);
        if (!suppress) {
            print_board();
            cout << mm << endl;
        }
        //do_command("ra -"+mm.word,suppress);
    } else if (command == "pm") { // Play move
        bool override = false;
        int i, j, p;
        string ss, acr;
        if (!(line >> ss)) return;
        if (ss == "-f") {
            override = true;
            if (!(line >> ss)) return;
        }
        if (!(line >> i) || !(line >> j)) i = j = (bsize + 1) / 2;
        if (!(line >> acr)) acr = "a";
        if (!(line >> p)) p = -1;

        for (char &c:ss) c = toupper(c);
        place_move(Move(ss, i, j, bsize, acr[0] != 'd', 0, p), override);
    } else if (command == "il") { // List legal moves
        int i, j, p;
        string ss, acr;
        if (!(line >> ss)) return;
        if (!(line >> i) || !(line >> j)) i = j = (bsize + 1) / 2;
        if (!(line >> acr)) acr = "a";
        if (!(line >> p)) p = -1;

        for (char &c:ss) c = toupper(c);
        Move m(ss, i, j, bsize, acr[0] != 'd', 0, p);
        bool leg = is_legal(m);
        cout << m << " legal: " << leg << endl;
    } else if (command == "rm") { // remove a tile from the board
        int i, j;
        if (!(line >> i >> j)) return;
        board[i][j] = 0;
        points[i][j] = 0;
    } else if (command == "pr") {
        string ss;
        line >> ss;
        for (char cc:ss) {
            switch (cc) {
                case 'b': // print the board
                    cout << "board:" << endl;
                    print_board();
                    break;
                case 'a': // prints the scores of adjacent words
                    print(adj[0], "adj[0]:", 3);
                    print(adj[1], "adj[1]:", 3);
                    break;
                case 'r': // print my rack
                    cout << "rack: ";
                    for (int i = 0; i < rack_size; i++) cout << rack[i];
                    cout << endl;
                    break;
                case 'l': // print letter bonus squares
                    print(letter_mult, "letter multipliers:");
                    break;
                case 'w': // print word bonus squares
                    print(word_mult, "word multipliers:");
                    break;
                case 'p': // print tile values
                    print(points, "tile values:", 3);
                    break;
                default:
                    cout << "Invalid print command: " << cc << endl;
                    break;
            }
        }
    } else if (command == "cl") {
        string ss;
        if (!(line >> ss)) return;
        ss[0] = toupper(ss[0]);
        calc_legal(ss[0]);
        print(legal[0][ss[0] - 'A'], "legal[0][" + ss + "]");
        print(legal[1][ss[0] - 'A'], "legal[1][" + ss + "]");
    } else if (command == "swap") {
        string ss;
        if (!(line >> ss)) return;
        for (char &c:ss) {
            char *pos = find(rack, rack + rack_size, toupper(c));
            if (pos != rack + rack_size) {
                std::swap(rack[pos - rack], bag[rand() % bag.size()]);
            }
        }
    } else if (command == "ra") {
        while (line) {
            string ss;
            line >> ss;
            if (ss[0] == '+') {
                if (isdigit(ss[1]))
                    for (int i = ss[1] - '0'; i-- && !bag.empty();) {
                        rack[rack_size++] = bag.back();
                        bag.pop_back();
                    }
                else
                    for (char &c:ss)
                        rack[rack_size++] = toupper(c);
            }
            if (ss[0] == '-') {
                for (int i = 1; i < ss.size(); i++) {
                    char *pos = find(rack, rack + rack_size, toupper(ss[i]));
                    if (pos != rack + rack_size)
                        std::move(pos + 1, rack + rack_size--, pos);
                }
            }
        }
        if (suppress) return;
        cout << "rack: ";
        for (int i = 0; i < rack_size; i++) cout << rack[i];
        cout << endl;
    } else if (command == "lm") {
        string st;
        int n = 999999, s = 0;
        bool use_heuristics = false;
        while (line >> st) {
            if (st[0] != '-') continue;
            stringstream ss;
            if (st.length() >= 3) ss << st.substr(3);
            switch (st[1]) {
                case 'n':
                    if (!(ss >> n)) n = 999999;
                    break;
                case 's':
                    if (!(ss >> s)) s = 0;
                    break;
                case 'h':
                    use_heuristics = true;
                    break;
            }
        }
        find_moves();
        sort_moves(use_heuristics);
        for (Move &m:moves) {
            if (m.score < s || n-- == 0) break;
            cout << setw(11) << setfill(' ') << m << endl;
        }
    } else if (command == "db") {
        line >> debug;
    } else if (command == "file") {
        string name;
        if (!(line >> name)) return;
        fstream fs{name};
        if (!fs) cout << name << " not found" << endl;
        while (fs) {
            string cm;
            getline(fs, cm);
            do_command(cm, suppress);
        }
    } else if (command == "word") {
        string w;
        if (!(line >> w)) return;
        for (char &c:w) c = toupper(int(c));
        cout << is_word(w) << endl;
    } else if (command == "clear") {
        clear();
    } else if (command == "ip") {
        string s;
        line >> s;
        int r_hash = 0;
        for (char c:s) {
            r_hash = ((r_hash + toupper(c) - 'A' + 1) * 27) % MOD;
        }
        cout << r_hash / 27 << ":" << chains[r_hash / 27] << endl;
    } else {
        cout << "Invalid command, try again." << endl;
    }
}